

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fetching.c
# Opt level: O0

int fetch_all_pathways_db(feed_db_t *db,pathway_t **records)

{
  int iVar1;
  void *pvVar2;
  uchar *puVar3;
  double dVar4;
  char local_2e8 [8];
  char qr [189];
  sqlite3_stmt *local_220;
  sqlite3_stmt *stmt;
  int local_210;
  int i;
  int record_count;
  feed_db_status_t res;
  pathway_t record;
  pathway_t **records_local;
  feed_db_t *db_local;
  
  record.reversed_signposted_as._120_8_ = records;
  local_210 = count_rows_db(db,"pathways");
  stmt._4_4_ = 0;
  db_local._4_4_ = local_210;
  if (0 < local_210) {
    memcpy(local_2e8,
           "SELECT pathway_id, from_stop_id, to_stop_id,pathway_mode, is_bidirectional, length, traversal_time, stair_count, max_slope, min_width,signposted_as, reversed_signposted_as FROM `pathways`;"
           ,0xbd);
    sqlite3_prepare_v2(db->conn,local_2e8,-1,&local_220,(char **)0x0);
    pvVar2 = malloc((long)local_210 * 0x1e8);
    *(void **)record.reversed_signposted_as._120_8_ = pvVar2;
    if (*(long *)record.reversed_signposted_as._120_8_ == 0) {
      sqlite3_finalize(local_220);
      db_local._4_4_ = -1;
    }
    else {
      do {
        iVar1 = sqlite3_step(local_220);
        db->rc = iVar1;
        if (iVar1 != 100) break;
        init_pathway((pathway_t *)&record_count);
        puVar3 = sqlite3_column_text(local_220,0);
        strcpy((char *)&record_count,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_220,1);
        strcpy(record.id + 0x38,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_220,2);
        strcpy(record.from_stop_id + 0x38,(char *)puVar3);
        record.to_stop_id._56_4_ = sqlite3_column_int(local_220,3);
        record.to_stop_id._60_4_ = sqlite3_column_int(local_220,4);
        record._192_8_ = sqlite3_column_double(local_220,5);
        dVar4 = sqlite3_column_double(local_220,6);
        record.length._0_4_ = (int)dVar4;
        dVar4 = sqlite3_column_double(local_220,7);
        record.length._4_4_ = (int)dVar4;
        record._208_8_ = sqlite3_column_double(local_220,8);
        record.max_slope = sqlite3_column_double(local_220,9);
        puVar3 = sqlite3_column_text(local_220,10);
        strcpy((char *)&record.min_width,(char *)puVar3);
        puVar3 = sqlite3_column_text(local_220,0xb);
        strcpy(record.signposted_as + 0x78,(char *)puVar3);
        memcpy((void *)(*(long *)record.reversed_signposted_as._120_8_ + (long)stmt._4_4_ * 0x1e8),
               &record_count,0x1e8);
        stmt._4_4_ = stmt._4_4_ + 1;
      } while (stmt._4_4_ < local_210);
      sqlite3_finalize(local_220);
      db_local._4_4_ = local_210;
    }
  }
  return db_local._4_4_;
}

Assistant:

int fetch_all_pathways_db(feed_db_t *db, pathway_t **records) {

    pathway_t record;
    feed_db_status_t res;

    int record_count = count_rows_db(db, "pathways");
    int i = 0;

    if (record_count < 1) {
        return record_count;
    }

    sqlite3_stmt *stmt;
    char qr[] = "SELECT "
                    "pathway_id, from_stop_id, to_stop_id,"
                    "pathway_mode, is_bidirectional, length, traversal_time, stair_count, max_slope, min_width,"
                    "signposted_as, reversed_signposted_as "
                "FROM `pathways`;";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    *records = malloc(record_count * sizeof(**records));
    if (*records == NULL) {
        sqlite3_finalize(stmt);
        return -1;
    }

    while ((db->rc = sqlite3_step(stmt)) == SQLITE_ROW) {
        init_pathway(&record);

        strcpy(record.id, sqlite3_column_text(stmt, 0));
        strcpy(record.from_stop_id, sqlite3_column_text(stmt, 1));
        strcpy(record.to_stop_id, sqlite3_column_text(stmt, 2));
        record.mode = (pathway_mode_t)sqlite3_column_int(stmt, 3);
        record.is_bidirectional = (pathway_directions_t)sqlite3_column_int(stmt, 4);
        record.length = sqlite3_column_double(stmt, 5);
        record.traversal_time = sqlite3_column_double(stmt, 6);
        record.stair_count = sqlite3_column_double(stmt, 7);
        record.max_slope = sqlite3_column_double(stmt, 8);
        record.min_width = sqlite3_column_double(stmt, 9);
        strcpy(record.signposted_as, sqlite3_column_text(stmt, 10));
        strcpy(record.reversed_signposted_as, sqlite3_column_text(stmt, 11));

        (*records)[i] = record;
        i++;

        if (i >= record_count)
            break;
    }

    sqlite3_finalize(stmt);
    return record_count;
}